

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_NewCFunctionData(JSContext *ctx,JSCFunctionData *func,int length,int magic,int data_len,
                           JSValue *data)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  JSValueUnion JVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar8;
  
  v = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xf);
  JVar4 = v.u;
  if ((v.tag & 0xffffffffU) != 6) {
    puVar5 = (undefined8 *)js_malloc(ctx,(long)data_len * 0x10 + 0x10);
    if (puVar5 == (undefined8 *)0x0) {
      if ((0xfffffff4 < (uint)v.tag) &&
         (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      uVar6 = 0;
      v = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_0011a4c0;
    }
    *puVar5 = func;
    *(char *)(puVar5 + 1) = (char)length;
    *(char *)((long)puVar5 + 9) = (char)data_len;
    *(short *)((long)puVar5 + 10) = (short)magic;
    if (0 < data_len) {
      lVar7 = 0;
      do {
        piVar2 = *(int **)((long)&data->u + lVar7);
        uVar3 = *(undefined8 *)((long)&data->tag + lVar7);
        if (0xfffffff4 < (uint)uVar3) {
          *piVar2 = *piVar2 + 1;
        }
        *(int **)((long)puVar5 + lVar7 + 0x10) = piVar2;
        *(undefined8 *)((long)puVar5 + lVar7 + 0x18) = uVar3;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uint)data_len << 4 != lVar7);
    }
    if ((uint)v.tag == 0xffffffff) {
      *(undefined8 **)((long)JVar4.ptr + 0x30) = puVar5;
    }
    js_function_set_properties(ctx,v,0x2f,length);
  }
  uVar6 = (ulong)JVar4.ptr & 0xffffffff00000000;
LAB_0011a4c0:
  JVar8.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar6);
  JVar8.tag = v.tag;
  return JVar8;
}

Assistant:

JSValue JS_NewCFunctionData(JSContext *ctx, JSCFunctionData *func,
                            int length, int magic, int data_len,
                            JSValueConst *data)
{
    JSCFunctionDataRecord *s;
    JSValue func_obj;
    int i;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                      JS_CLASS_C_FUNCTION_DATA);
    if (JS_IsException(func_obj))
        return func_obj;
    s = js_malloc(ctx, sizeof(*s) + data_len * sizeof(JSValue));
    if (!s) {
        JS_FreeValue(ctx, func_obj);
        return JS_EXCEPTION;
    }
    s->func = func;
    s->length = length;
    s->data_len = data_len;
    s->magic = magic;
    for(i = 0; i < data_len; i++)
        s->data[i] = JS_DupValue(ctx, data[i]);
    JS_SetOpaque(func_obj, s);
    js_function_set_properties(ctx, func_obj,
                               JS_ATOM_empty_string, length);
    return func_obj;
}